

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode req_send_buffer_add(Curl_easy *data,char *buf,size_t blen,size_t hds_len)

{
  ssize_t sVar1;
  ssize_t n;
  size_t sStack_30;
  CURLcode result;
  size_t hds_len_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  n._4_4_ = CURLE_OK;
  sStack_30 = hds_len;
  hds_len_local = blen;
  blen_local = (size_t)buf;
  buf_local = (char *)data;
  sVar1 = Curl_bufq_write(&(data->req).sendbuf,(uchar *)buf,blen,(CURLcode *)((long)&n + 4));
  if (sVar1 < 0) {
    data_local._4_4_ = n._4_4_;
  }
  else {
    *(size_t *)(buf_local + 0x198) = sStack_30 + *(long *)(buf_local + 0x198);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode req_send_buffer_add(struct Curl_easy *data,
                                    const char *buf, size_t blen,
                                    size_t hds_len)
{
  CURLcode result = CURLE_OK;
  ssize_t n;
  n = Curl_bufq_write(&data->req.sendbuf,
                      (const unsigned char *)buf, blen, &result);
  if(n < 0)
    return result;
  /* We rely on a SOFTLIMIT on sendbuf, so it can take all data in */
  DEBUGASSERT((size_t)n == blen);
  data->req.sendbuf_hds_len += hds_len;
  return CURLE_OK;
}